

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O3

XUtf8FontStruct * XCreateUtf8FontStruct(Display *dpy,char *base_font_name_list)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  XUtf8FontStruct *__ptr;
  char **ppcVar5;
  ushort **ppuVar6;
  char *pcVar7;
  ulong uVar8;
  XFontStruct **ppXVar9;
  int *piVar10;
  undefined8 *puVar11;
  XFontStruct *pXVar12;
  int *piVar13;
  uint uVar14;
  size_t __size;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  int iVar18;
  int j;
  long lVar19;
  long lVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  int cnt;
  int local_3c;
  int *local_38;
  
  __ptr = (XUtf8FontStruct *)malloc(0x38);
  if (__ptr == (XUtf8FontStruct *)0x0) {
    return (XUtf8FontStruct *)0x0;
  }
  iVar4 = 1;
  pcVar22 = base_font_name_list;
  do {
    if (*pcVar22 == ',') {
      iVar4 = iVar4 + 1;
    }
    else if (*pcVar22 == '\0') goto LAB_001faf79;
    pcVar22 = pcVar22 + 1;
  } while( true );
LAB_001fb245:
  while (bVar1 != 0) {
    if (bVar1 == 0x5b) {
      piVar10[uVar23 * 2] = 0xffff;
      lVar19 = 0;
      do {
        piVar10[uVar23 * 2 + 1] = (int)lVar19;
        do {
          if ((*pbVar17 == 0) || (*pbVar17 == 0x5d)) goto LAB_001fb1e2;
          pbVar15 = pbVar17 + 1;
          pbVar17 = pbVar15;
          while( true ) {
            uVar14 = *pbVar17 - 0x20;
            if (((uVar14 < 0x40) && ((0xa000000000000001U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) ||
               (*pbVar17 == 0)) break;
            pbVar17 = pbVar17 + 1;
          }
          lVar19 = strtol((char *)pbVar15,(char **)0x0,0);
          iVar4 = (int)lVar19;
          if (iVar4 < piVar10[uVar23 * 2]) {
            piVar10[uVar23 * 2] = iVar4;
          }
        } while (iVar4 <= piVar10[uVar23 * 2 + 1]);
      } while( true );
    }
    pbVar15 = pbVar17 + 1;
    pbVar17 = pbVar17 + 1;
    bVar1 = *pbVar15;
  }
LAB_001fb1e2:
  uVar23 = uVar23 + 1;
  if (uVar23 == uVar8) {
    iVar4 = __ptr->nb_font;
    __ptr->encodings = piVar13;
    if (0 < (long)iVar4) {
      lVar19 = 0;
      local_38 = piVar10;
      do {
        if ((lVar19 != 0) && (ppcVar5[lVar19] != (char *)0x0)) {
          lVar20 = 0;
          do {
            if (((ppcVar5[lVar20] != (char *)0x0) && (piVar13[lVar20] == piVar13[lVar19])) &&
               ((piVar10[lVar20 * 2] == piVar10[lVar19 * 2] &&
                ((piVar10[lVar20 * 2 + 1] != 0 && (piVar10[lVar19 * 2 + 1] != 0)))))) {
              XFreeFont(dpy,ppXVar9[lVar19]);
              free(ppcVar5[lVar19]);
              ppcVar5[lVar19] = (char *)0x0;
              ppXVar9[lVar19] = (XFontStruct *)0x0;
              piVar10 = local_38;
            }
            lVar20 = lVar20 + 1;
          } while (lVar19 != lVar20);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != iVar4);
      return __ptr;
    }
    return __ptr;
  }
  goto LAB_001fb16b;
LAB_001faf79:
  ppcVar5 = (char **)malloc((long)iVar4 << 3);
  __ptr->font_name_list = ppcVar5;
  if (*base_font_name_list != '\0') {
    uVar14 = 0;
    ppuVar6 = __ctype_b_loc();
    do {
      pcVar22 = base_font_name_list + -1;
      do {
        pcVar21 = pcVar22;
        uVar8 = (ulong)(byte)pcVar21[1];
        pcVar22 = pcVar21 + 1;
      } while ((*(byte *)((long)*ppuVar6 + uVar8 * 2 + 1) & 0x20) != 0);
      __size = 2;
      lVar19 = 0;
      while ((cVar3 = (char)uVar8, cVar3 != '\0' && ((int)uVar8 != 0x2c))) {
        pbVar15 = (byte *)(pcVar21 + __size);
        __size = __size + 1;
        lVar19 = lVar19 + 1;
        uVar8 = (ulong)*pbVar15;
      }
      if (2 < (int)__size - 2U) {
        pcVar7 = (char *)malloc(__size);
        ppcVar5[(int)uVar14] = pcVar7;
        uVar8 = 0;
        do {
          ppcVar5[(int)uVar14][uVar8] = pcVar22[uVar8];
          uVar8 = uVar8 + 1;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
        ppcVar5[(int)uVar14][uVar8 & 0xffffffff] = '\0';
        uVar14 = uVar14 + 1;
        cVar3 = pcVar21[__size - 1];
      }
      base_font_name_list = pcVar22 + (__size - (cVar3 == '\0')) + -1;
    } while (*base_font_name_list != '\0');
    if (0 < (int)uVar14) {
      __ptr->nb_font = uVar14;
      uVar8 = (ulong)uVar14;
      ppXVar9 = (XFontStruct **)malloc(uVar8 * 8);
      __ptr->fonts = ppXVar9;
      piVar10 = (int *)malloc(uVar8 * 8);
      __ptr->ranges = piVar10;
      __ptr->fid = 0;
      __ptr->ascent = 0;
      __ptr->descent = 0;
      iVar4 = 0;
      iVar18 = 0;
      uVar23 = 0;
      do {
        puVar11 = (undefined8 *)XListFonts(dpy,ppcVar5[uVar23],1,&local_3c);
        if ((local_3c == 0) || (puVar11 == (undefined8 *)0x0)) {
          ppXVar9[uVar23] = (XFontStruct *)0x0;
LAB_001fb12f:
          free(ppcVar5[uVar23]);
          ppcVar5[uVar23] = (char *)0x0;
        }
        else {
          free(ppcVar5[uVar23]);
          pcVar22 = strdup((char *)*puVar11);
          ppcVar5[uVar23] = pcVar22;
          pXVar12 = (XFontStruct *)XLoadQueryFont(dpy,pcVar22);
          XFreeFontNames(puVar11);
          ppXVar9[uVar23] = pXVar12;
          if (pXVar12 == (XFontStruct *)0x0) goto LAB_001fb12f;
          __ptr->fid = pXVar12->fid;
          iVar2 = pXVar12->ascent;
          if (iVar18 < iVar2) {
            __ptr->ascent = iVar2;
            iVar18 = iVar2;
          }
          iVar2 = pXVar12->descent;
          if (iVar4 < iVar2) {
            __ptr->descent = iVar2;
            iVar4 = iVar2;
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar8 != uVar23);
      ppcVar5 = __ptr->font_name_list;
      piVar10 = __ptr->ranges;
      piVar13 = (int *)malloc(uVar8 * 4);
      uVar23 = 0;
LAB_001fb16b:
      pbVar15 = (byte *)ppcVar5[uVar23];
      (piVar10 + uVar23 * 2)[0] = 0;
      (piVar10 + uVar23 * 2)[1] = 0xffff;
      if (pbVar15 == (byte *)0x0) {
LAB_001fb1da:
        piVar13[uVar23] = 1;
      }
      else {
        pcVar22 = strstr((char *)pbVar15,"fontspecific");
        if (pcVar22 == (char *)0x0) {
          iVar4 = 0;
          do {
            while( true ) {
              pbVar17 = pbVar15 + 1;
              bVar1 = *pbVar15;
              pbVar15 = pbVar17;
              if (bVar1 == 0x2d) break;
              if (bVar1 == 0) goto LAB_001fb1da;
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 != 0xd);
          iVar4 = encoding_number((char *)pbVar17);
          piVar13[uVar23] = iVar4;
          if (iVar4 != 0) goto LAB_001fb1d6;
          for (; bVar1 = *pbVar17, bVar1 != 0; pbVar17 = pbVar17 + 1) {
            if (bVar1 == 0x2d) goto LAB_001fb245;
          }
        }
        else {
          pbVar17 = pbVar15 + -1;
          do {
            pbVar15 = pbVar15 + 1;
            pbVar16 = pbVar17 + 1;
            pbVar17 = pbVar17 + 1;
          } while (*pbVar16 != 0x2d);
          do {
            bVar1 = *pbVar15;
            pbVar15 = pbVar15 + 1;
            pbVar17 = pbVar15;
          } while (bVar1 != 0x2d);
          do {
            pbVar16 = pbVar17;
            pbVar17 = pbVar16 + 1;
          } while (*pbVar16 != 0x2d);
          *pbVar16 = 0;
          iVar4 = encoding_number((char *)pbVar15);
          *pbVar16 = 0x2d;
          piVar13[uVar23] = iVar4;
LAB_001fb1d6:
          if (iVar4 < 0) goto LAB_001fb1da;
        }
      }
      goto LAB_001fb1e2;
    }
  }
  free(ppcVar5);
  free(__ptr);
  return (XUtf8FontStruct *)0x0;
}

Assistant:

XUtf8FontStruct *
XCreateUtf8FontStruct(Display    *dpy,
		      const char *base_font_name_list) {

  XUtf8FontStruct *font_set;

  font_set = (XUtf8FontStruct*)malloc(sizeof(XUtf8FontStruct));

  if (!font_set) {
    return NULL;
  }

  font_set->nb_font = get_font_list(base_font_name_list,
				    &font_set->font_name_list);

  if (font_set->nb_font < 1) {
    free(font_set);
    return NULL;
  }

  load_fonts(dpy, font_set);

  return font_set;
}